

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O3

TestStatus * __thiscall
vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorPool::Parameters>::iterate
          (TestStatus *__return_storage_ptr__,
          FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorPool::Parameters> *this)

{
  undefined4 uVar1;
  Context *pCVar2;
  Function p_Var3;
  Parameters PVar4;
  vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> local_30;
  
  pCVar2 = (this->super_TestInstance).m_context;
  p_Var3 = (this->m_args).func;
  uVar1 = (this->m_args).arg0.flags;
  PVar4 = SUB41(uVar1,0);
  std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::vector
            (&local_30,&(this->m_args).arg0.poolSizes);
  (*p_Var3)(__return_storage_ptr__,pCVar2,PVar4);
  if (local_30.
      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	iterate				(void) { return m_args.func(m_context, m_args.arg0); }